

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int uriCommonTest(char *filename,char *result,char *err,char *base)

{
  int iVar1;
  char *__filename;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  int local_450;
  int ret;
  int i;
  int res;
  char str [1024];
  FILE *f;
  FILE *o;
  char *temp;
  char *base_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  ret = 0;
  __filename = resultFilename(filename,temp_directory,".res");
  if (__filename == (char *)0x0) {
    fprintf(_stderr,"Out of memory\n");
    fatalError();
  }
  __stream = fopen64(__filename,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"failed to open output file %s\n",__filename);
    free(__filename);
    filename_local._4_4_ = -1;
  }
  else {
    str._1016_8_ = fopen64(filename,"rb");
    if ((FILE *)str._1016_8_ == (FILE *)0x0) {
      fprintf(_stderr,"failed to open input file %s\n",filename);
      fclose(__stream);
      if (__filename != (char *)0x0) {
        unlink(__filename);
        free(__filename);
      }
      filename_local._4_4_ = -1;
    }
    else {
      while (pcVar2 = fgets((char *)&i,0x3ff,(FILE *)str._1016_8_), pcVar2 != (char *)0x0) {
        sVar3 = strlen((char *)&i);
        local_450 = (int)sVar3;
        while( true ) {
          bVar4 = false;
          if ((((0 < local_450) &&
               (bVar4 = true, *(char *)((long)&i + (long)(local_450 + -1)) != '\n')) &&
              (bVar4 = true, *(char *)((long)&i + (long)(local_450 + -1)) != '\r')) &&
             (bVar4 = true, *(char *)((long)&i + (long)(local_450 + -1)) != ' ')) {
            bVar4 = *(char *)((long)&i + (long)(local_450 + -1)) == '\t';
          }
          if (!bVar4) break;
          local_450 = local_450 + -1;
          *(undefined1 *)((long)&i + (long)local_450) = 0;
        }
        nb_tests = nb_tests + 1;
        handleURI((char *)&i,base,(FILE *)__stream);
      }
      fclose((FILE *)str._1016_8_);
      fclose(__stream);
      if (result != (char *)0x0) {
        iVar1 = compareFiles(__filename,result);
        if (iVar1 != 0) {
          fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
        }
        ret = (int)(iVar1 != 0);
      }
      if ((err != (char *)0x0) &&
         (iVar1 = compareFileMem(err,testErrors,testErrorsSize), iVar1 != 0)) {
        fprintf(_stderr,"Error for %s failed\n",filename);
        ret = 1;
      }
      if (__filename != (char *)0x0) {
        unlink(__filename);
        free(__filename);
      }
      filename_local._4_4_ = ret;
    }
  }
  return filename_local._4_4_;
}

Assistant:

static int
uriCommonTest(const char *filename,
             const char *result,
             const char *err,
             const char *base) {
    char *temp;
    FILE *o, *f;
    char str[1024];
    int res = 0, i, ret;

    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    o = fopen(temp, "wb");
    if (o == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	return(-1);
    }
    f = fopen(filename, "rb");
    if (f == NULL) {
	fprintf(stderr, "failed to open input file %s\n", filename);
	fclose(o);
        if (temp != NULL) {
            unlink(temp);
            free(temp);
        }
	return(-1);
    }

    while (1) {
	/*
	 * read one line in string buffer.
	 */
	if (fgets (&str[0], sizeof (str) - 1, f) == NULL)
	   break;

	/*
	 * remove the ending spaces
	 */
	i = strlen(str);
	while ((i > 0) &&
	       ((str[i - 1] == '\n') || (str[i - 1] == '\r') ||
		(str[i - 1] == ' ') || (str[i - 1] == '\t'))) {
	    i--;
	    str[i] = 0;
	}
	nb_tests++;
	handleURI(str, base, o);
    }

    fclose(f);
    fclose(o);

    if (result != NULL) {
	ret = compareFiles(temp, result);
	if (ret) {
	    fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	    res = 1;
	}
    }
    if (err != NULL) {
	ret = compareFileMem(err, testErrors, testErrorsSize);
	if (ret != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    res = 1;
	}
    }

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    return(res);
}